

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O1

void DeviceAmstradCPCPLUS(CDevice **dev,CDevice *parent,aint ramtop)

{
  CDevice *device;
  char *pcVar1;
  
  if (ramtop != 0) {
    WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
  }
  device = (CDevice *)operator_new(0x2838);
  device->Next = (CDevice *)0x0;
  device->SlotsCount = 0;
  device->PagesCount = 0;
  device->Memory = (byte *)0x0;
  device->ZxRamTop = 0;
  device->CurrentSlot = 0;
  device->previousSlotI = 0;
  device->previousSlotOpt = O_NONE;
  device->limitExceeded = false;
  pcVar1 = strdup("AMSTRADCPCPLUS");
  device->ID = pcVar1;
  if (parent != (CDevice *)0x0) {
    parent->Next = device;
  }
  memset(device->Slots,0,0x2800);
  *dev = device;
  initRegularSlotDevice(device,0x4000,4,0x20,(int *)&DAT_0015f630);
  return;
}

Assistant:

static void DeviceAmstradCPCPLUS(CDevice** dev, CDevice* parent, aint ramtop) {
	if (ramtop) WarningById(W_NO_RAMTOP);
	*dev = new CDevice("AMSTRADCPCPLUS", parent);
	const int initialPages[] = { 0, 1, 2, 3 };
	initRegularSlotDevice(*dev, 0x4000, 4, 32, initialPages);	// 32*16kiB = 512MiB (maximum cartridge size)
}